

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O2

void __thiscall tonk::SDKConnection::SetSelfReference(SDKConnection *this)

{
  __shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tonk::SDKConnection,void>
            ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<tonk::SDKConnection>);
  std::__shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->SelfReference).
              super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void SetSelfReference()
    {
        SelfReference = shared_from_this();
    }